

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

bool __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::grant_ownership
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,
          color_quad<unsigned_char,_int> *pPixels,uint width,uint height,uint pitch,uint flags)

{
  bool bVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  uint in_ECX;
  uint in_EDX;
  color_quad<unsigned_char,_int> *in_RSI;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDI;
  uint in_R8D;
  uint in_R9D;
  color_quad<unsigned_char,_int> *pcVar3;
  bool local_1;
  
  if (in_R8D == 0xffffffff) {
    in_R8D = in_EDX;
  }
  if ((((in_RSI == (color_quad<unsigned_char,_int> *)0x0) || (in_EDX == 0)) || (in_ECX == 0)) ||
     (in_R8D < in_EDX)) {
    local_1 = false;
  }
  else {
    pcVar3 = in_RSI;
    pcVar2 = get_ptr(in_RDI);
    if (pcVar3 == pcVar2) {
      local_1 = false;
    }
    else {
      clear(in_RDI);
      bVar1 = vector<crnlib::color_quad<unsigned_char,_int>_>::grant_ownership
                        ((vector<crnlib::color_quad<unsigned_char,_int>_> *)CONCAT44(in_R8D,in_R9D),
                         (color_quad<unsigned_char,_int> *)in_RDI,(uint)((ulong)pcVar3 >> 0x20),
                         (uint)pcVar3);
      if (bVar1) {
        in_RDI->m_pPixels = in_RSI;
        in_RDI->m_width = in_EDX;
        in_RDI->m_height = in_ECX;
        in_RDI->m_pitch = in_R8D;
        in_RDI->m_total = in_R8D * in_ECX;
        in_RDI->m_comp_flags = in_R9D;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool grant_ownership(color_type* pPixels, uint width, uint height, uint pitch = UINT_MAX, uint flags = pixel_format_helpers::cDefaultCompFlags) {
    if (pitch == UINT_MAX)
      pitch = width;

    if ((!pPixels) || (!width) || (!height) || (pitch < width)) {
      CRNLIB_ASSERT(0);
      return false;
    }

    if (pPixels == get_ptr()) {
      CRNLIB_ASSERT(0);
      return false;
    }

    clear();

    if (!m_pixel_buf.grant_ownership(pPixels, height * pitch, height * pitch))
      return false;

    m_pPixels = pPixels;

    m_width = width;
    m_height = height;
    m_pitch = pitch;
    m_total = pitch * height;
    m_comp_flags = flags;

    return true;
  }